

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O0

void parse_with_opts_should_return_parse_end(void)

{
  cJSON *item_00;
  long in_FS_OFFSET;
  cJSON *item;
  char *parse_end;
  char json [18];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  parse_end = (char *)0x7974706d65205d5b;
  builtin_strncpy(json," array XD",10);
  item = (cJSON *)0x0;
  item_00 = cJSON_ParseWithOpts((char *)&parse_end,(char **)&item,0);
  if (item_00 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x4f);
  }
  UnityAssertEqualNumber
            ((long)&parse_end + 2,(UNITY_INT)item,(char *)0x0,0x50,UNITY_DISPLAY_STYLE_HEX64);
  cJSON_Delete(item_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff0) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void parse_with_opts_should_return_parse_end(void)
{
    const char json[] = "[] empty array XD";
    const char *parse_end = NULL;

    cJSON *item = cJSON_ParseWithOpts(json, &parse_end, false);
    TEST_ASSERT_NOT_NULL(item);
    TEST_ASSERT_EQUAL_PTR(json + 2, parse_end);
    cJSON_Delete(item);
}